

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O3

uint64_t capnp::compiler::generateRandomId(void)

{
  int iVar1;
  Exception *pEVar2;
  OwnFd fd;
  ssize_t n;
  Fault f_2;
  Fault f_1;
  uint64_t result;
  OwnFd local_6c;
  Fault local_68;
  Fault local_60;
  Fault local_58;
  undefined8 uStack_50;
  char *local_48;
  undefined8 local_40;
  undefined1 local_38;
  ulong local_28;
  
  do {
    local_6c.fd = open("/dev/urandom",0);
    if (-1 < local_6c.fd) goto LAB_003a8c97;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_68.exception = (Exception *)0x0;
    local_58.exception = (Exception *)0x0;
    uStack_50 = 0;
    kj::_::Debug::Fault::init
              (&local_68,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/parser.c++"
              );
    kj::_::Debug::Fault::fatal(&local_68);
  }
LAB_003a8c97:
  do {
    pEVar2 = (Exception *)read(local_6c.fd,&local_28,8);
    local_68.exception = pEVar2;
    if (-1 < (long)pEVar2) goto LAB_003a8cd2;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault<int,char_const(&)[13]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/parser.c++"
               ,0x40,iVar1,"n = read(fd, &result, sizeof(result))","\"/dev/urandom\"",
               (char (*) [13])"/dev/urandom");
    kj::_::Debug::Fault::fatal(&local_58);
  }
LAB_003a8cd2:
  local_58.exception = (Exception *)&local_68;
  uStack_50 = 8;
  local_48 = " == ";
  local_40 = 5;
  local_38 = pEVar2 == (Exception *)0x8;
  if ((bool)local_38) {
    kj::OwnFd::~OwnFd(&local_6c);
    return local_28 | 0x8000000000000000;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<long&,unsigned_long>&,char_const(&)[35],long&>
            (&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/parser.c++"
             ,0x41,FAILED,"n == sizeof(result)",
             "_kjCondition,\"Incomplete read from /dev/urandom.\", n",
             (DebugComparison<long_&,_unsigned_long> *)&local_58,
             (char (*) [35])"Incomplete read from /dev/urandom.",(long *)local_58.exception);
  kj::_::Debug::Fault::fatal(&local_60);
}

Assistant:

uint64_t generateRandomId() {
  uint64_t result;

#if _WIN32
  HCRYPTPROV handle;
  KJ_ASSERT(CryptAcquireContextW(&handle, nullptr, nullptr,
                                 PROV_RSA_FULL, CRYPT_VERIFYCONTEXT | CRYPT_SILENT));
  KJ_DEFER(KJ_ASSERT(CryptReleaseContext(handle, 0)) {break;});

  KJ_ASSERT(CryptGenRandom(handle, sizeof(result), reinterpret_cast<BYTE*>(&result)));

#else
  auto fd = KJ_SYSCALL_FD(open("/dev/urandom", O_RDONLY));

  ssize_t n;
  KJ_SYSCALL(n = read(fd, &result, sizeof(result)), "/dev/urandom");
  KJ_ASSERT(n == sizeof(result), "Incomplete read from /dev/urandom.", n);
#endif

  return result | (1ull << 63);
}